

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O0

void xsurv0_send_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  xsurv0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x3b8));
  if (nVar1 == NNG_OK) {
    nni_msgq_aio_get(*(nni_msgq **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x28));
  }
  else {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x3b8));
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x3b8),(nni_msg *)0x0);
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xsurv0_send_cb(void *arg)
{
	xsurv0_pipe *p = arg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->npipe);
		return;
	}

	nni_msgq_aio_get(p->sendq, &p->aio_getq);
}